

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

float tansig_approx(float x)

{
  float fVar1;
  float fVar2;
  double dVar3;
  float local_20;
  float sign;
  float dy;
  float y;
  int i;
  float x_local;
  
  local_20 = 1.0;
  if (x < 8.0) {
    if (-8.0 < x) {
      if (NAN(x)) {
        i = 0;
      }
      else {
        y = x;
        if (x < 0.0) {
          y = -x;
          local_20 = -1.0;
        }
        dVar3 = floor((double)(y * 25.0 + 0.5));
        fVar2 = (float)(int)dVar3 * -0.04 + y;
        fVar1 = tansig_table[(int)dVar3];
        i = (int)(local_20 * (fVar2 * (-fVar1 * fVar1 + 1.0) * (-fVar1 * fVar2 + 1.0) + fVar1));
      }
    }
    else {
      i = -0x40800000;
    }
  }
  else {
    i = 0x3f800000;
  }
  return (float)i;
}

Assistant:

static OPUS_INLINE float tansig_approx(float x) {
    int i;
    float y, dy;
    float sign = 1;
    /* Tests are reversed to catch NaNs */
    if (!(x < 8)) return 1;
    if (!(x > -8)) return -1;
#ifndef FIXED_POINT
    /* Another check in case of -ffast-math*/ // 浮点优化选项 -ffast-math：极大地提高浮点运算速度
    if (celt_isnan(x)) return 0;
#endif
    if (x < 0) {
        x = -x;
        sign = -1;
    }
    i = (int) floor(.5f + 25 * x);
    x -= .04f * i;
    y = tansig_table[i];
    dy = 1 - y * y;
    y = y + x * dy * (1 - y * x);
    return sign * y;
}